

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O0

Gia_Man_t * Gia_ManUpdateExtraAig(void *pTime,Gia_Man_t *p,Vec_Int_t *vBoxPres)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *vOutPres_00;
  Gia_Man_t *pGVar4;
  int local_44;
  int local_40;
  int curPo;
  int k;
  int i;
  Vec_Int_t *vOutPres;
  Tim_Man_t *pManTime;
  Gia_Man_t *pNew;
  Vec_Int_t *vBoxPres_local;
  Gia_Man_t *p_local;
  void *pTime_local;
  
  vOutPres_00 = Vec_IntAlloc(100);
  local_44 = 0;
  iVar1 = Vec_IntSize(vBoxPres);
  iVar2 = Tim_ManBoxNum((Tim_Man_t *)pTime);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(vBoxPres) == Tim_ManBoxNum(pManTime)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0x2b9,"Gia_Man_t *Gia_ManUpdateExtraAig(void *, Gia_Man_t *, Vec_Int_t *)");
  }
  iVar1 = Gia_ManCoNum(p);
  iVar2 = Tim_ManCiNum((Tim_Man_t *)pTime);
  iVar3 = Tim_ManPiNum((Tim_Man_t *)pTime);
  if (iVar1 == iVar2 - iVar3) {
    curPo = 0;
    while( true ) {
      iVar1 = Tim_ManBoxNum((Tim_Man_t *)pTime);
      if (iVar1 <= curPo) break;
      local_40 = 0;
      while( true ) {
        iVar1 = Tim_ManBoxOutputNum((Tim_Man_t *)pTime,curPo);
        if (iVar1 <= local_40) break;
        iVar1 = Vec_IntEntry(vBoxPres,curPo);
        Vec_IntPush(vOutPres_00,iVar1);
        local_40 = local_40 + 1;
      }
      iVar1 = Tim_ManBoxOutputNum((Tim_Man_t *)pTime,curPo);
      local_44 = iVar1 + local_44;
      curPo = curPo + 1;
    }
    iVar1 = Gia_ManCoNum(p);
    if (local_44 == iVar1) {
      pGVar4 = Gia_ManDupOutputVec(p,vOutPres_00);
      Vec_IntFree(vOutPres_00);
      return pGVar4;
    }
    __assert_fail("curPo == Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0x2c1,"Gia_Man_t *Gia_ManUpdateExtraAig(void *, Gia_Man_t *, Vec_Int_t *)");
  }
  __assert_fail("Gia_ManCoNum(p) == Tim_ManCiNum(pManTime) - Tim_ManPiNum(pManTime)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                ,0x2ba,"Gia_Man_t *Gia_ManUpdateExtraAig(void *, Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Gia_ManUpdateExtraAig( void * pTime, Gia_Man_t * p, Vec_Int_t * vBoxPres )
{
    Gia_Man_t * pNew;
    Tim_Man_t * pManTime = (Tim_Man_t *)pTime;
    Vec_Int_t * vOutPres = Vec_IntAlloc( 100 );
    int i, k, curPo = 0;
    assert( Vec_IntSize(vBoxPres) == Tim_ManBoxNum(pManTime) );
    assert( Gia_ManCoNum(p) == Tim_ManCiNum(pManTime) - Tim_ManPiNum(pManTime) );
    for ( i = 0; i < Tim_ManBoxNum(pManTime); i++ )
    {
        for ( k = 0; k < Tim_ManBoxOutputNum(pManTime, i); k++ )
            Vec_IntPush( vOutPres, Vec_IntEntry(vBoxPres, i) );
        curPo += Tim_ManBoxOutputNum(pManTime, i);
    }
    assert( curPo == Gia_ManCoNum(p) );
    pNew = Gia_ManDupOutputVec( p, vOutPres );
    Vec_IntFree( vOutPres );
    return pNew;
}